

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::finalizeMemory(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var2;
  pointer puVar3;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var4;
  pointer ppGVar5;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *memory;
  long lVar6;
  Const *pCVar7;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  ulong uVar12;
  pointer ppGVar13;
  ulong uVar14;
  Name NVar15;
  Literal local_88;
  Builder *local_70;
  ulong local_68;
  pointer local_60;
  FindAll<wasm::GlobalGet> local_58;
  TranslateToFuzzReader *local_40;
  pointer local_38;
  
  pMVar1 = this->wasm;
  local_38 = (pMVar1->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (pMVar1->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (pMVar1->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar11) {
    local_70 = &this->builder;
    local_60 = puVar11;
    local_40 = this;
    do {
      _Var8._M_head_impl =
           (puVar10->_M_t).
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
           super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      uVar12 = (long)*(pointer *)((long)&(_Var8._M_head_impl)->data + 8) -
               *(long *)&((_Var8._M_head_impl)->data).
                         super__Vector_base<char,_std::allocator<char>_>;
      if ((_Var8._M_head_impl)->isPassive == false) {
        if (((this->wasm->features).features & 0x400) == 0) {
          local_68 = uVar12;
          FindAll<wasm::GlobalGet>::FindAll(&local_58,(_Var8._M_head_impl)->offset);
          ppGVar5 = local_58.list.
                    super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppGVar13 = local_58.list.
                          super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_start; ppGVar13 != ppGVar5;
              ppGVar13 = ppGVar13 + 1) {
            NVar15.super_IString.str._M_str = (char *)((*ppGVar13)->name).super_IString.str._M_len;
            NVar15.super_IString.str._M_len = (size_t)local_40->wasm;
            lVar6 = wasm::Module::getGlobal(NVar15);
            if (*(long *)(lVar6 + 0x20) != 0) {
              __assert_fail("!wasm.getGlobal(get->name)->imported()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                            ,0x2f2,"void wasm::TranslateToFuzzReader::finalizeMemory()");
            }
            Literal::makeFromInt32
                      (&local_88,0,
                       (Type)*(uintptr_t *)
                              ((long)(local_38->_M_t).
                                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              + 0x50));
            pCVar7 = Builder::makeConst(local_70,&local_88);
            ((puVar10->_M_t).
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset =
                 (Expression *)pCVar7;
            wasm::Literal::~Literal(&local_88);
          }
          if (local_58.list.
              super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.list.
                            super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.list.
                                  super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.list.
                                  super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          _Var8._M_head_impl =
               (puVar10->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
          puVar11 = local_60;
          uVar12 = local_68;
          this = local_40;
        }
        if ((_Var8._M_head_impl)->offset->_id == ConstId) {
          lVar6 = wasm::Literal::getInteger();
          uVar12 = uVar12 + lVar6;
        }
      }
      if (uVar12 < 0x40000001) {
        _Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
             (local_38->_M_t).
             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
        uVar14 = uVar12 + 0xffff >> 0x10;
        uVar12 = *(ulong *)((long)_Var2.
                                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                  .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38)
        ;
        if (uVar14 < uVar12) {
          uVar14 = uVar12;
        }
        *(ulong *)((long)_Var2.
                         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) = uVar14;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar11);
  }
  _Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (local_38->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
  uVar12 = (this->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr;
  if (uVar12 < *(ulong *)((long)_Var2.
                                super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38))
  {
    uVar12 = *(ulong *)((long)_Var2.
                              super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                              .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38);
  }
  *(ulong *)((long)_Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                   _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) = uVar12;
  if (*(ulong *)((long)_Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                       super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) ==
      0xffffffffffffffff) {
    *(ulong *)((long)_Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                     _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                     .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) = uVar12;
  }
  else if (uVar12 < *(ulong *)((long)_Var2.
                                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                     .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl +
                              0x40)) goto LAB_001380d0;
  uVar12 = uVar12 + 1;
  if (0xffff < uVar12) {
    uVar12 = 0x10000;
  }
  *(ulong *)((long)_Var2.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                   _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40) = uVar12;
LAB_001380d0:
  if (this->preserveImportsAndExports == false) {
    puVar3 = (this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (this->wasm->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1)
    {
      _Var4._M_head_impl =
           (puVar9->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      *(undefined8 *)
       &((Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x28))->super_IString = 0;
      *(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x30) = (char *)0x0;
      _Var4._M_head_impl =
           (puVar9->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      *(undefined8 *)
       &((Name *)((long)&(_Var4._M_head_impl)->super_Importable + 0x18))->super_IString = 0;
      *(char **)((long)&(_Var4._M_head_impl)->super_Importable + 0x20) = (char *)0x0;
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::finalizeMemory() {
  auto& memory = wasm.memories[0];
  for (auto& segment : wasm.dataSegments) {
    Address maxOffset = segment->data.size();
    if (!segment->isPassive) {
      if (!wasm.features.hasGC()) {
        // Using a non-imported global in a segment offset is not valid in wasm
        // unless GC is enabled. This can occur due to us adding a local
        // definition to what used to be an imported global in initial contents.
        // To fix that, replace such invalid offsets with a constant.
        for ([[maybe_unused]] auto* get :
             FindAll<GlobalGet>(segment->offset).list) {
          // No imported globals should remain.
          assert(!wasm.getGlobal(get->name)->imported());
          // TODO: It would be better to avoid segment overlap so that
          //       MemoryPacking can run.
          segment->offset =
            builder.makeConst(Literal::makeFromInt32(0, memory->addressType));
        }
      }
      if (auto* offset = segment->offset->dynCast<Const>()) {
        maxOffset = maxOffset + offset->value.getInteger();
      }
    }

    // Ensure the initial memory can fit the segment (so we don't just trap),
    // but only do so when the segment is at a reasonable offset (to avoid
    // validation errors on the initial size >= 4GB in wasm32, but also to
    // avoid OOM errors on trying to allocate too much initial memory, which is
    // annoying in the fuzzer).
    Address ONE_GB = 1024 * 1024 * 1024;
    if (maxOffset <= ONE_GB) {
      memory->initial = std::max(
        memory->initial,
        Address((maxOffset + Memory::kPageSize - 1) / Memory::kPageSize));
    }
  }
  memory->initial = std::max(memory->initial, fuzzParams->USABLE_MEMORY);
  // Avoid an unlimited memory size, which would make fuzzing very difficult
  // as different VMs will run out of system memory in different ways.
  if (memory->max == Memory::kUnlimitedSize) {
    memory->max = memory->initial;
  }
  if (memory->max <= memory->initial) {
    // To allow growth to work (which a testcase may assume), try to make the
    // maximum larger than the initial.
    // TODO: scan the wasm for grow instructions?
    memory->max =
      std::min(Address(memory->initial + 1), Address(Memory::kMaxSize32));
  }

  if (!preserveImportsAndExports) {
    // Avoid an imported memory (which the fuzz harness would need to handle).
    for (auto& memory : wasm.memories) {
      memory->module = memory->base = Name();
    }
  }
}